

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void Commands::Shutdown(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Command_Source *from)

{
  undefined8 local_28 [4];
  
  (*from->_vptr_Command_Source[2])(local_28);
  Console::Wrn("Server shut down by %s",local_28[0]);
  std::__cxx11::string::~string((string *)local_28);
  eoserv_sig_abort = 1;
  return;
}

Assistant:

void Shutdown(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Wrn("Server shut down by %s", from->SourceName().c_str());
	eoserv_sig_abort = true;
}